

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_fxadd(sexp ctx,sexp a,sexp_uint_t b)

{
  ulong uVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  ulong uVar5;
  
  puVar3 = (undefined1 *)0x1;
  puVar2 = (undefined1 *)((long)&((a->value).type.cpl)->tag + 2);
  do {
    puVar4 = puVar2;
    if (puVar4 == (undefined1 *)0x3) {
      puVar4 = (undefined1 *)0x1;
      goto LAB_0011909a;
    }
    puVar2 = puVar4 + -1;
  } while (*(long *)(&a->tag + (long)puVar4 * 2) == 0);
  puVar4 = puVar4 + -2;
LAB_0011909a:
  do {
    uVar1 = *(ulong *)((long)&a->value + (long)puVar3 * 8 + 8);
    *(ulong *)((long)&a->value + (long)puVar3 * 8 + 8) = uVar1 + b;
    uVar5 = ~b;
    if (puVar4 <= puVar3) break;
    b = (sexp_uint_t)(uVar5 < uVar1);
    puVar3 = puVar3 + 1;
  } while (uVar5 < uVar1);
  if (uVar5 < uVar1) {
    a = sexp_copy_bignum(ctx,(sexp)0x0,a,(sexp_uint_t)(puVar4 + 1));
    *(undefined8 *)((long)&a->value + (long)puVar4 * 8 + 0x10) = 1;
  }
  return a;
}

Assistant:

sexp sexp_bignum_fxadd (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a),
    carry=b, i=0, n;
  do { n = data[i];
       data[i] += carry;
       carry = (n > (SEXP_UINT_T_MAX - carry));
  } while (++i<len && carry);
  if (carry) {
    a = sexp_copy_bignum(ctx, NULL, a, len+1);
    sexp_bignum_data(a)[len] = 1;
  }
  return a;
}